

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

Test * CLParserTestFilterInputFilename::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x10);
  CLParserTestFilterInputFilename((CLParserTestFilterInputFilename *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST(CLParserTest, FilterInputFilename) {
  ASSERT_TRUE(CLParser::FilterInputFilename("foobar.cc"));
  ASSERT_TRUE(CLParser::FilterInputFilename("foo bar.cc"));
  ASSERT_TRUE(CLParser::FilterInputFilename("baz.c"));
  ASSERT_TRUE(CLParser::FilterInputFilename("FOOBAR.CC"));

  ASSERT_FALSE(CLParser::FilterInputFilename(
                   "src\\cl_helper.cc(166) : fatal error C1075: end "
                   "of file found ..."));
}